

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O3

int lejp_parse(lejp_ctx *ctx,uchar *json,int len)

{
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  char cVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  uint8_t uVar14;
  uint uVar15;
  uint8_t *puVar16;
  long lVar17;
  undefined8 uVar18;
  int iVar19;
  
  if ((ctx->sp == '\0') && (ctx->pst[ctx->pst_sp].ppos == '\0')) {
    (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x02');
  }
  if (len != 0) {
    do {
      iVar1 = len + -1;
      pbVar2 = json + 1;
      bVar8 = *json;
      uVar12 = (ulong)bVar8;
      bVar3 = ctx->sp;
      uVar7 = (ulong)bVar3;
      bVar5 = ctx->st[uVar7].s;
      bVar13 = bVar5;
      if (uVar12 < 0x24) {
        if ((0x900002200U >> (uVar12 & 0x3f) & 1) == 0) {
          if (uVar12 != 10) goto LAB_0010593d;
          ctx->line = ctx->line + 1;
          bVar13 = bVar5 & 0xdf;
          ctx->st[uVar7].s = bVar13;
        }
        if ((bVar5 & 0x40) != 0) goto LAB_0010593d;
        if (bVar8 == 0x23) {
          ctx->st[uVar7].s = bVar13 | 0x20;
        }
        goto switchD_00105959_caseD_49;
      }
LAB_0010593d:
      if ((bVar13 & 0x20) != 0) goto switchD_00105959_caseD_49;
      uVar11 = (uint)bVar8;
      uVar6 = (uint)bVar3;
      switch(bVar5) {
      case 0x43:
        if (bVar8 == 0x5c) {
          ctx->st[uVar7].s = 'D';
        }
        else {
          if (bVar8 != 0x22) {
            if (bVar8 < 0x20) {
              iVar19 = 0xfa;
              goto LAB_00106619;
            }
            goto LAB_00105fb1;
          }
          if (bVar3 == 0) {
            iVar19 = 0xfb;
            goto LAB_00106619;
          }
          if (ctx->st[uVar6 - 1].s != '\t') {
            ctx->buf[ctx->npos] = '\0';
            cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'M');
            if (cVar4 < '\0') goto LAB_001064e5;
            bVar3 = ctx->sp;
          }
          ctx->sp = bVar3 - 1;
        }
        break;
      case 0x44:
        if (bVar8 != 0x75) {
          lVar17 = 0;
          while (uVar11 != (int)"\"\\/bfnrt"[lVar17]) {
            lVar17 = lVar17 + 1;
            if (lVar17 == 9) {
              iVar19 = 0xf9;
              goto LAB_00106619;
            }
          }
          bVar8 = "\"\\/\b\f\n\r\t"[lVar17];
          ctx->st[uVar7].s = 'C';
          goto LAB_00105fb1;
        }
        ctx->st[uVar7].s = 'E';
        ctx->uni = 0;
        break;
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
        iVar19 = *(int *)&ctx->uni * 0x10;
        ctx->uni = (uint16_t)iVar19;
        uVar10 = (ushort)bVar8;
        if ((byte)(bVar8 - 0x30) < 10) {
          uVar11 = ((uint)uVar10 + iVar19) - 0x30;
        }
        else if ((byte)(bVar8 + 0x9f) < 6) {
          uVar11 = uVar10 - 0x57;
        }
        else {
          if (5 < (byte)(bVar8 + 0xbf)) {
            iVar19 = 0xf8;
            goto LAB_00106619;
          }
          uVar11 = uVar10 - 0x37;
        }
        uVar10 = (ushort)uVar11;
        ctx->uni = uVar10;
        ctx->st[uVar7].s = bVar13 + 1;
        bVar8 = (byte)uVar11;
        if (bVar5 == 0x48) {
          uVar15 = (uint)(bVar8 & 0x3f | 0x80);
          if (uVar10 < 0x80) {
            uVar15 = uVar11;
          }
          bVar8 = (byte)uVar15;
          ctx->st[uVar7].s = 'C';
        }
        else if (bVar5 == 0x47) {
          if ((uVar11 & 0xffff) < 0x80) {
            if (uVar10 < 8) break;
            bVar8 = bVar8 >> 2 | 0xc0;
          }
          else {
            bVar8 = bVar8 >> 2 | 0x80;
          }
        }
        else {
          if ((bVar5 != 0x46) || (uVar10 < 8)) break;
          bVar8 = bVar8 >> 4 | 0xe0;
        }
LAB_00105fb1:
        if ((bVar3 == 0) || (ctx->st[uVar6 - 1].s != '\t')) {
          bVar3 = ctx->npos;
          uVar14 = bVar3 + 1;
          ctx->npos = uVar14;
          ctx->buf[bVar3] = bVar8;
          if (uVar14 == 0xfe) {
            cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'L');
            if (cVar4 != '\0') goto LAB_001064e5;
            ctx->npos = '\0';
            json = pbVar2;
            len = iVar1;
            goto LAB_001061ce;
          }
        }
        else {
          bVar3 = ctx->pst[ctx->pst_sp].ppos;
          ctx->pst[ctx->pst_sp].ppos = bVar3 + 1;
          ctx->path[bVar3] = bVar8;
        }
        break;
      case 0x49:
      case 0x4a:
        break;
      case 0x4b:
        if (bVar8 == 0x2d && ctx->npos == 0) {
          ctx->f = ctx->f | 1;
        }
        else {
          bVar3 = ctx->dcount;
          if ((byte)(bVar8 - 0x30) < 10 && bVar3 < 0x14) {
            if ((ctx->f & 2) != 0) {
              ctx->f = ctx->f | 4;
            }
            ctx->dcount = bVar3 + 1;
          }
          else {
            if (bVar8 != 0x2e) {
              bVar5 = ctx->f;
              if ((bVar5 & 6) == 2) {
                iVar19 = 0xf5;
                goto LAB_00106619;
              }
              if ((bVar8 & 0xdf) == 0x45) {
                if ((bVar5 & 8) == 0) {
                  ctx->f = bVar5 | 8;
                  ctx->st[uVar7].s = 'L';
                  goto LAB_001061a5;
                }
              }
              else if (bVar3 != 0) {
                ctx->buf[ctx->npos] = '\0';
                if ((bVar5 & 2) == 0) {
                  cVar4 = 'I';
                }
                else {
                  cVar4 = 'J';
                }
                cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,cVar4);
                if (cVar4 != '\0') goto LAB_001064e5;
                ctx->st[ctx->sp].s = '\x0e';
                goto LAB_001061ce;
              }
              iVar19 = 0xf4;
              goto LAB_00106619;
            }
            iVar19 = 0xf4;
            if ((bVar3 == 0) || ((ctx->f & 2) != 0)) goto LAB_00106619;
            ctx->f = ctx->f | 2;
          }
        }
        goto LAB_001061a5;
      case 0x4c:
        ctx->st[uVar7].s = 'K';
        if ((byte)(bVar8 - 0x30) < 10) goto LAB_001061ce;
        if ((uVar11 != 0x2b) && (uVar11 != 0x2d)) {
          iVar19 = 0xf3;
          goto LAB_00106619;
        }
LAB_001061a5:
        bVar3 = ctx->npos;
        if ((ulong)bVar3 == 0xff) {
          iVar19 = 0xec;
LAB_00106619:
          (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x04');
          return iVar19;
        }
        ctx->npos = bVar3 + 1;
        ctx->buf[bVar3] = bVar8;
        break;
      case 0x4d:
        uVar10 = ctx->uni;
        if (uVar11 != (int)"rue alse ull "[uVar10]) {
          iVar19 = 0xf2;
          goto LAB_00106619;
        }
        ctx->uni = (uint16_t)(uVar10 + 1);
        if ((0x1108UL >> ((ulong)(uVar10 + 1) & 0x3f) & 1) == 0) break;
        if (uVar10 == 0xb) {
          ctx->buf[0] = '\0';
          lVar17 = (ulong)ctx->pst_sp << 5;
          uVar18 = 0x48;
LAB_00106212:
          cVar4 = (**(code **)((long)&ctx->pst[0].callback + lVar17))(ctx,uVar18);
          if (cVar4 != '\0') goto LAB_001064f4;
        }
        else {
          if (uVar10 == 7) {
            ctx->buf[0] = '0';
            ctx->buf[1] = '\0';
            lVar17 = (ulong)ctx->pst_sp << 5;
            uVar18 = 0x47;
            goto LAB_00106212;
          }
          if (uVar10 == 2) {
            ctx->buf[0] = '1';
            ctx->buf[1] = '\0';
            lVar17 = (ulong)ctx->pst_sp << 5;
            uVar18 = 0x46;
            goto LAB_00106212;
          }
        }
        ctx->st[ctx->sp].s = '\x0e';
        json = pbVar2;
        len = iVar1;
        goto LAB_001061ce;
      default:
        switch(bVar5) {
        case 0:
          if (bVar8 != 0x7b) {
            iVar19 = 0xfe;
            goto LAB_00106619;
          }
          cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x10');
          if (cVar4 == '\0') {
            ctx->st[ctx->sp].s = '\x01';
            json = pbVar2;
            len = iVar1;
            break;
          }
LAB_001064e5:
          iVar19 = 0xe9;
          goto LAB_00106619;
        case 1:
          if (bVar8 == 0x7d) {
            ctx->st[uVar7].s = '\0';
            iVar19 = 0xfd;
            goto LAB_00106619;
          }
          ctx->st[uVar7].s = '\x02';
          break;
        case 2:
          if (bVar8 != 0x22) {
            iVar19 = 0xfc;
            goto LAB_00106619;
          }
          ctx->st[uVar7].s = '\t';
          cVar9 = 'C';
LAB_00105cba:
          bVar3 = ctx->pst[ctx->pst_sp].ppos;
          uVar7 = (ulong)bVar3;
          bVar5 = ctx->sp;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else if ((ctx->st[bVar5].s & 0xfeU) != 0xe) {
            puVar16 = &ctx->pst[ctx->pst_sp].ppos;
            *puVar16 = bVar3 + 1;
            ctx->path[uVar7] = '.';
            uVar7 = (ulong)*puVar16;
          }
          ctx->st[bVar5].p = (char)uVar7;
          ctx->st[bVar5].i = ctx->ipos;
          bVar5 = bVar5 + 1;
          ctx->sp = bVar5;
          if (bVar5 == 0xc) {
            iVar19 = 0xee;
            goto LAB_00106619;
          }
          ctx->path[uVar7] = '\0';
          ctx->st[bVar5].s = cVar9;
          ctx->st[bVar5].b = '\0';
        default:
          goto switchD_00105959_caseD_49;
        case 9:
          if (bVar8 != 0x3a) {
            iVar19 = 0xf7;
            goto LAB_00106619;
          }
          ctx->st[uVar7].s = '\n';
          ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
          lejp_check_path_match(ctx);
          cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x05');
          json = pbVar2;
          len = iVar1;
          if (cVar4 == '\0') break;
LAB_001064f4:
          iVar19 = 0xe9;
          goto LAB_00106619;
        case 10:
          if (9 < (byte)(bVar8 - 0x30)) {
            iVar19 = 0xf6;
            if (bVar8 < 0x66) {
              if (bVar8 == 0x22) {
                ctx->st[uVar7].s = '\x0e';
                ctx->npos = '\0';
                ctx->buf[0] = '\0';
                cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\v');
                cVar9 = 'C';
                if (cVar4 != '\0') goto LAB_001064f4;
              }
              else {
                if (bVar8 != 0x5b) {
                  if (uVar11 != 0x5d) goto LAB_00106619;
                  if (bVar3 == 0) goto LAB_0010656a;
                  bVar3 = bVar3 - 1;
                  ctx->sp = bVar3;
                  uVar7 = (ulong)bVar3;
                  if (ctx->st[uVar7].s != '\x0f') goto LAB_00106575;
                  bVar5 = ctx->pst_sp;
                  if (uVar7 == 0) {
                    bVar3 = ctx->pst[bVar5].ppos;
                  }
                  else {
                    bVar3 = ctx->st[bVar3 - 1].p;
                    ctx->pst[bVar5].ppos = bVar3;
                    ctx->ipos = ctx->st[uVar7 - 1].i;
                  }
                  ctx->path[bVar3] = '\0';
                  bVar3 = ctx->pst[bVar5].ppos;
                  if ((ctx->path_match != '\0') && (bVar3 <= ctx->path_match_len)) {
                    ctx->path_match = '\0';
                  }
                  ctx->path[bVar3] = '\0';
                  goto LAB_0010648c;
                }
                ctx->st[uVar7].s = '\x0f';
                bVar3 = ctx->pst_sp;
                bVar5 = ctx->pst[bVar3].ppos;
                ctx->pst[bVar3].ppos = bVar5 + 1;
                ctx->path[bVar5] = '[';
                bVar5 = ctx->pst[bVar3].ppos;
                ctx->pst[bVar3].ppos = bVar5 + 1;
                ctx->path[bVar5] = ']';
                ctx->path[ctx->pst[bVar3].ppos] = '\0';
                cVar4 = (*ctx->pst[bVar3].callback)(ctx,'\x0e');
                if (cVar4 != '\0') goto LAB_001064e5;
                bVar3 = ctx->ipos;
                bVar5 = bVar3 + 1;
                ctx->ipos = bVar5;
                ctx->i[bVar3] = 0;
                cVar9 = '\n';
                if (5 < bVar5) {
                  iVar19 = 0xed;
                  goto LAB_00106619;
                }
              }
              goto LAB_00105cba;
            }
            if (uVar11 == 0x73 || bVar8 < 0x73) {
              if (bVar8 == 0x66) {
                ctx->uni = 4;
              }
              else {
                if (bVar8 != 0x6e) goto LAB_00106619;
                ctx->uni = 9;
              }
            }
            else {
              if (bVar8 != 0x74) {
                if (bVar8 != 0x7b) goto LAB_00106619;
                ctx->st[uVar7].s = '\x0e';
                lejp_check_path_match(ctx);
                cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x10');
                if (cVar4 != '\0') goto LAB_001064e5;
                ctx->path_match = '\0';
                cVar9 = '\x01';
                goto LAB_00105cba;
              }
              ctx->uni = 0;
            }
            ctx->st[uVar7].s = 'M';
            goto switchD_00105959_caseD_49;
          }
          ctx->npos = '\0';
          ctx->dcount = '\0';
          ctx->f = '\0';
          ctx->st[uVar7].s = 'K';
          break;
        case 0xe:
          puVar16 = &ctx->pst[ctx->pst_sp].ppos;
          ctx->path[*puVar16] = '\0';
          if (uVar11 == 0x7d) {
            if (bVar3 == 0) {
              lejp_check_path_match(ctx);
              cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x11');
              iVar19 = 0xe9;
              if (cVar4 == '\0') {
                cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x03');
                iVar19 = 0xea;
                if (cVar4 == '\0') {
                  return iVar1;
                }
              }
              goto LAB_00106619;
            }
            bVar3 = bVar3 - 1;
            ctx->sp = bVar3;
            if (bVar3 == 0) {
              bVar5 = *puVar16;
            }
            else {
              bVar5 = ctx->st[bVar3].p;
              *puVar16 = bVar5;
              ctx->ipos = ctx->st[bVar3].i;
            }
            ctx->path[bVar5] = '\0';
            if ((ctx->path_match != '\0') && (*puVar16 <= ctx->path_match_len)) {
              ctx->path_match = '\0';
            }
            lejp_check_path_match(ctx);
            cVar4 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x11');
            json = pbVar2;
            len = iVar1;
            if (cVar4 != '\0') goto LAB_001064f4;
          }
          else {
            if (uVar11 != 0x5d) {
              if (uVar11 != 0x2c) {
                iVar19 = 0xeb;
                goto LAB_00106619;
              }
              ctx->st[uVar7].s = '\x02';
              if (bVar3 == 0) {
                *puVar16 = '\0';
                ctx->path_match = '\0';
              }
              else {
                bVar3 = ctx->st[uVar6 - 1].p;
                *puVar16 = bVar3;
                ctx->path[bVar3] = '\0';
                if ((ctx->path_match != '\0') && (*puVar16 <= ctx->path_match_len)) {
                  ctx->path_match = '\0';
                }
                if (ctx->st[uVar7 - 1].s == '\x0f') {
                  if (ctx->ipos != 0) {
                    ctx->i[ctx->ipos - 1] = ctx->i[ctx->ipos - 1] + 1;
                  }
                  ctx->st[uVar7].s = '\n';
                }
              }
              goto switchD_00105959_caseD_49;
            }
            if (bVar3 == 0) {
LAB_0010656a:
              iVar19 = 0xf1;
              goto LAB_00106619;
            }
            bVar3 = bVar3 - 1;
            ctx->sp = bVar3;
            uVar7 = (ulong)bVar3;
            if (ctx->st[uVar7].s != '\x0f') {
LAB_00106575:
              iVar19 = 0xf0;
              goto LAB_00106619;
            }
            if (uVar7 == 0) {
              bVar3 = *puVar16;
            }
            else {
              bVar3 = ctx->st[bVar3 - 1].p;
              *puVar16 = bVar3;
              ctx->ipos = ctx->st[uVar7 - 1].i;
            }
            ctx->path[bVar3] = '\0';
            if ((ctx->path_match != '\0') && (*puVar16 <= ctx->path_match_len)) {
              ctx->path_match = '\0';
            }
          }
          break;
        case 0xf:
          bVar5 = ctx->pst_sp;
          ctx->path[ctx->pst[bVar5].ppos] = '\0';
          if (uVar11 != 0x5d) {
            if (uVar11 != 0x2c) {
              iVar19 = 0xef;
              goto LAB_00106619;
            }
            if (ctx->ipos != 0) {
              ctx->i[ctx->ipos - 1] = ctx->i[ctx->ipos - 1] + 1;
            }
            puVar16 = &ctx->pst[bVar5].ppos;
            ctx->st[uVar7].s = '\n';
            if (bVar3 == 0) {
              bVar3 = *puVar16;
            }
            else {
              bVar3 = ctx->st[uVar6 - 1].p;
              *puVar16 = bVar3;
            }
            ctx->path[bVar3] = '\0';
            goto switchD_00105959_caseD_49;
          }
LAB_0010648c:
          ctx->st[uVar7].s = '\x0e';
          (*ctx->pst[bVar5].callback)(ctx,'\x0f');
          json = pbVar2;
          len = iVar1;
        }
        goto LAB_001061ce;
      }
switchD_00105959_caseD_49:
      json = pbVar2;
      len = iVar1;
LAB_001061ce:
    } while (len != 0);
  }
  return -1;
}

Assistant:

int
lejp_parse(struct lejp_ctx *ctx, const unsigned char *json, int len)
{
	unsigned char c, n, s, ret = LEJP_REJECT_UNKNOWN;
	static const char esc_char[] = "\"\\/bfnrt";
	static const char esc_tran[] = "\"\\/\b\f\n\r\t";
	static const char tokens[] = "rue alse ull ";

	if (!ctx->sp && !ctx->pst[ctx->pst_sp].ppos)
		ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_START);

	while (len--) {
		c = *json++;
		s = ctx->st[ctx->sp].s;

		/* skip whitespace unless we should care */
		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' || c == '#') {
			if (c == '\n') {
				ctx->line++;
				ctx->st[ctx->sp].s &= ~LEJP_FLAG_WS_COMMENTLINE;
			}
			if (!(s & LEJP_FLAG_WS_KEEP)) {
				if (c == '#')
					ctx->st[ctx->sp].s |=
						LEJP_FLAG_WS_COMMENTLINE;
				continue;
			}
		}

		if (ctx->st[ctx->sp].s & LEJP_FLAG_WS_COMMENTLINE)
			continue;

		switch (s) {
		case LEJP_IDLE:
			if (c != '{') {
				ret = LEJP_REJECT_IDLE_NO_BRACE;
				goto reject;
			}
			if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_START)) {
				ret = LEJP_REJECT_CALLBACK;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_MEMBERS;
			break;
		case LEJP_MEMBERS:
			if (c == '}') {
				ctx->st[ctx->sp].s = LEJP_IDLE;
				ret = LEJP_REJECT_MEMBERS_NO_CLOSE;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_M_P;
			goto redo_character;
		case LEJP_M_P:
			if (c != '\"') {
				ret = LEJP_REJECT_MP_NO_OPEN_QUOTE;
				goto reject;
			}
			/* push */
			ctx->st[ctx->sp].s = LEJP_MP_DELIM;
			c = LEJP_MP_STRING;
			goto add_stack_level;

		case LEJP_MP_STRING:
			if (c == '\"') {
				if (!ctx->sp) { /* JSON can't end on quote */
					ret = LEJP_REJECT_MP_STRING_UNDERRUN;
					goto reject;
				}
				if (ctx->st[ctx->sp - 1].s != LEJP_MP_DELIM) {
					ctx->buf[ctx->npos] = '\0';
					if (ctx->pst[ctx->pst_sp].callback(ctx,
						      LEJPCB_VAL_STR_END) < 0) {
						ret = LEJP_REJECT_CALLBACK;
						goto reject;
					}
				}
				/* pop */
				ctx->sp--;
				break;
			}
			if (c == '\\') {
				ctx->st[ctx->sp].s = LEJP_MP_STRING_ESC;
				break;
			}
			if (c < ' ') {/* "control characters" not allowed */
				ret = LEJP_REJECT_MP_ILLEGAL_CTRL;
				goto reject;
			}
			goto emit_string_char;

		case LEJP_MP_STRING_ESC:
			if (c == 'u') {
				ctx->st[ctx->sp].s = LEJP_MP_STRING_ESC_U1;
				ctx->uni = 0;
				break;
			}
			for (n = 0; n < sizeof(esc_char); n++) {
				if (c != esc_char[n])
					continue;
				/* found it */
				c = esc_tran[n];
				ctx->st[ctx->sp].s = LEJP_MP_STRING;
				goto emit_string_char;
			}
			ret = LEJP_REJECT_MP_STRING_ESC_ILLEGAL_ESC;
			/* illegal escape char */
			goto reject;

		case LEJP_MP_STRING_ESC_U1:
		case LEJP_MP_STRING_ESC_U2:
		case LEJP_MP_STRING_ESC_U3:
		case LEJP_MP_STRING_ESC_U4:
			ctx->uni <<= 4;
			if (c >= '0' && c <= '9')
				ctx->uni |= c - '0';
			else
				if (c >= 'a' && c <= 'f')
					ctx->uni = c - 'a' + 10;
				else
					if (c >= 'A' && c <= 'F')
						ctx->uni = c - 'A' + 10;
					else {
						ret = LEJP_REJECT_ILLEGAL_HEX;
						goto reject;
					}
			ctx->st[ctx->sp].s++;
			switch (s) {
			case LEJP_MP_STRING_ESC_U2:
				if (ctx->uni < 0x08)
					break;
				/*
				 * 0x08-0xff (0x0800 - 0xffff)
				 * emit 3-byte UTF-8
				 */
				c = 0xe0 | ((ctx->uni >> 4) & 0xf);
				goto emit_string_char;

			case LEJP_MP_STRING_ESC_U3:
				if (ctx->uni >= 0x080) {
					/*
					 * 0x080 - 0xfff (0x0800 - 0xffff)
					 * middle 3-byte seq
					 * send ....XXXXXX..
					 */
					c = 0x80 | ((ctx->uni >> 2) & 0x3f);
					goto emit_string_char;
				}
				if (ctx->uni < 0x008)
					break;
				/*
				 * 0x008 - 0x7f (0x0080 - 0x07ff)
				 * start 2-byte seq
				 */
				c = 0xc0 | (ctx->uni >> 2);
				goto emit_string_char;

			case LEJP_MP_STRING_ESC_U4:
				if (ctx->uni >= 0x0080)
					/* end of 2 or 3-byte seq */
					c = 0x80 | (ctx->uni & 0x3f);
				else
					/* literal */
					c = (unsigned char)ctx->uni;

				ctx->st[ctx->sp].s = LEJP_MP_STRING;
				goto emit_string_char;
			default:
				break;
			}
			break;

		case LEJP_MP_DELIM:
			if (c != ':') {
				ret = LEJP_REJECT_MP_DELIM_MISSING_COLON;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_MP_VALUE;
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';

			lejp_check_path_match(ctx);
			if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_PAIR_NAME)) {
				ret = LEJP_REJECT_CALLBACK;
				goto reject;
			}
			break;

		case LEJP_MP_VALUE:
			if (c >= '0' && c <= '9') {
				ctx->npos = 0;
				ctx->dcount = 0;
				ctx->f = 0;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_INT;
				goto redo_character;
			}
			switch (c) {
			case'\"':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
				c = LEJP_MP_STRING;
				ctx->npos = 0;
				ctx->buf[0] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_STR_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				goto add_stack_level;

			case '{':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
				c = LEJP_MEMBERS;
				lejp_check_path_match(ctx);
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->path_match = 0;
				goto add_stack_level;

			case '[':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_ARRAY_END;
				c = LEJP_MP_VALUE;
				ctx->path[ctx->pst[ctx->pst_sp].ppos++] = '[';
				ctx->path[ctx->pst[ctx->pst_sp].ppos++] = ']';
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_ARRAY_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->i[ctx->ipos++] = 0;
				if (ctx->ipos > LWS_ARRAY_SIZE(ctx->i)) {
					ret = LEJP_REJECT_MP_DELIM_ISTACK;
					goto reject;
				}
				goto add_stack_level;

			case ']':
				/* pop */
				if (!ctx->sp) { /* JSON can't end on ] */
					ret = LEJP_REJECT_MP_C_OR_E_UNDERF;
					goto reject;
				}
				ctx->sp--;
				if (ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END) {
					ret = LEJP_REJECT_MP_C_OR_E_NOTARRAY;
					goto reject;
				}
				/* drop the path [n] bit */
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
					ctx->ipos = ctx->st[ctx->sp - 1].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
				    ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;
				goto array_end;

			case 't': /* true */
				ctx->uni = 0;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;

			case 'f':
				ctx->uni = 4;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;

			case 'n':
				ctx->uni = 4 + 5;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;
			default:
				ret = LEJP_REJECT_MP_DELIM_BAD_VALUE_START;
				goto reject;
			}
			break;

		case LEJP_MP_VALUE_NUM_INT:
			if (!ctx->npos && c == '-') {
				ctx->f |= LEJP_SEEN_MINUS;
				goto append_npos;
			}

			if (ctx->dcount < 20 && c >= '0' && c <= '9') {
				if (ctx->f & LEJP_SEEN_POINT)
					ctx->f |= LEJP_SEEN_POST_POINT;
				ctx->dcount++;
				goto append_npos;
			}
			if (c == '.') {
				if (!ctx->dcount || (ctx->f & LEJP_SEEN_POINT)) {
					ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
					goto reject;
				}
				ctx->f |= LEJP_SEEN_POINT;
				goto append_npos;
			}
			/*
			 * before exponent, if we had . we must have had at
			 * least one more digit
			 */
			if ((ctx->f &
				(LEJP_SEEN_POINT | LEJP_SEEN_POST_POINT)) ==
							      LEJP_SEEN_POINT) {
				ret = LEJP_REJECT_MP_VAL_NUM_INT_NO_FRAC;
				goto reject;
			}
			if (c == 'e' || c == 'E') {
				if (ctx->f & LEJP_SEEN_EXP) {
					ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
					goto reject;
				}
				ctx->f |= LEJP_SEEN_EXP;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_EXP;
				goto append_npos;
			}
			/* if none of the above, did we even have a number? */
			if (!ctx->dcount) {
				ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
				goto reject;
			}

			ctx->buf[ctx->npos] = '\0';
			if (ctx->f & LEJP_SEEN_POINT) {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NUM_FLOAT)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
			} else {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NUM_INT)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
			}

			/* then this is the post-number character, loop */
			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			goto redo_character;

		case LEJP_MP_VALUE_NUM_EXP:
			ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_INT;
			if (c >= '0' && c <= '9')
				goto redo_character;
			if (c == '+' || c == '-')
				goto append_npos;
			ret = LEJP_REJECT_MP_VAL_NUM_EXP_BAD_EXP;
			goto reject;

		case LEJP_MP_VALUE_TOK: /* true, false, null */
			if (c != tokens[ctx->uni]) {
				ret = LEJP_REJECT_MP_VAL_TOK_UNKNOWN;
				goto reject;
			}
			ctx->uni++;
			if (tokens[ctx->uni] != ' ')
				break;
			switch (ctx->uni) {
			case 3:
				ctx->buf[0] = '1';
				ctx->buf[1] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_TRUE)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			case 8:
				ctx->buf[0] = '0';
				ctx->buf[1] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_FALSE)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			case 12:
				ctx->buf[0] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NULL)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			}
			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			break;

		case LEJP_MP_COMMA_OR_END:
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
			if (c == ',') {
				/* increment this stack level's index */
				ctx->st[ctx->sp].s = LEJP_M_P;
				if (!ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = 0;
					/*
					 * since we came back to root level,
					 * no path can still match
					 */
					ctx->path_match = 0;
					break;
				}
				ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
						ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				if (ctx->st[ctx->sp - 1].s != LEJP_MP_ARRAY_END)
					break;
				/* top level is definitely an array... */
				if (ctx->ipos)
					ctx->i[ctx->ipos - 1]++;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE;
				break;
			}
			if (c == ']') {
				if (!ctx->sp) {  /* JSON can't end on ] */
					ret = LEJP_REJECT_MP_C_OR_E_UNDERF;
					goto reject;
				}
				/* pop */
				ctx->sp--;
				if (ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END) {
					ret = LEJP_REJECT_MP_C_OR_E_NOTARRAY;
					goto reject;
				}
				/* drop the path [n] bit */
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
					ctx->ipos = ctx->st[ctx->sp - 1].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
						ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				/* do LEJP_MP_ARRAY_END processing */
				goto redo_character;
			}
			if (c == '}') {
				if (!ctx->sp) {
					lejp_check_path_match(ctx);
					if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_END)) {
						ret = LEJP_REJECT_CALLBACK;
						goto reject;
					}
					if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_COMPLETE))
						goto reject;
					else
						/* done, return unused amount */
						return len;
				}

				/* pop */

				ctx->sp--;
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos =
							ctx->st[ctx->sp].p;
					ctx->ipos = ctx->st[ctx->sp].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
				    ctx->pst[ctx->pst_sp].ppos <=
						    ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				lejp_check_path_match(ctx);
				if (ctx->pst[ctx->pst_sp].callback(ctx,
							LEJPCB_OBJECT_END)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			}

			ret = LEJP_REJECT_MP_C_OR_E_NEITHER;
			goto reject;

		case LEJP_MP_ARRAY_END:
array_end:
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
			if (c == ',') {
				/* increment this stack level's index */
				if (ctx->ipos)
					ctx->i[ctx->ipos - 1]++;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE;
				if (ctx->sp)
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				break;
			}
			if (c != ']') {
				ret = LEJP_REJECT_MP_ARRAY_END_MISSING;
				goto reject;
			}

			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_ARRAY_END);
			break;
		}

		continue;

emit_string_char:
		if (!ctx->sp || ctx->st[ctx->sp - 1].s != LEJP_MP_DELIM) {
			/* assemble the string value into chunks */
			ctx->buf[ctx->npos++] = c;
			if (ctx->npos == sizeof(ctx->buf) - 1) {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_STR_CHUNK)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->npos = 0;
			}
			continue;
		}
		/* name part of name:value pair */
		ctx->path[ctx->pst[ctx->pst_sp].ppos++] = c;
		continue;

add_stack_level:
		/* push on to the object stack */
		if (ctx->pst[ctx->pst_sp].ppos &&
		    ctx->st[ctx->sp].s != LEJP_MP_COMMA_OR_END &&
		    ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END)
			ctx->path[ctx->pst[ctx->pst_sp].ppos++] = '.';

		ctx->st[ctx->sp].p = ctx->pst[ctx->pst_sp].ppos;
		ctx->st[ctx->sp].i = ctx->ipos;
		if (++ctx->sp == LWS_ARRAY_SIZE(ctx->st)) {
			ret = LEJP_REJECT_STACK_OVERFLOW;
			goto reject;
		}
		ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
		ctx->st[ctx->sp].s = c;
		ctx->st[ctx->sp].b = 0;
		continue;

append_npos:
		if (ctx->npos >= sizeof(ctx->buf)) {
			ret = LEJP_REJECT_NUM_TOO_LONG;
			goto reject;
		}
		ctx->buf[ctx->npos++] = c;
		continue;

redo_character:
		json--;
		len++;
	}

	return LEJP_CONTINUE;

reject:
	ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_FAILED);
	return ret;
}